

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BringWindowToFront(ImGuiWindow *window)

{
  ImGuiWindow **ppIVar1;
  ImGuiContext *pIVar2;
  long lVar3;
  ImGuiWindow **ppIVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  pIVar2 = GImGui;
  iVar5 = (GImGui->Windows).Size;
  lVar3 = (long)iVar5;
  if (lVar3 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                  ,0x4ca,"value_type &ImVector<ImGuiWindow *>::back() [T = ImGuiWindow *]");
  }
  ppIVar4 = (GImGui->Windows).Data;
  if (((ppIVar4[lVar3 + -1] != window) && (ppIVar4[lVar3 + -1]->RootWindow != window)) &&
     (iVar5 != 1)) {
    uVar7 = (ulong)(iVar5 - 1);
    do {
      uVar6 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar6;
      if (ppIVar4[uVar7] == window) {
        ppIVar1 = ppIVar4 + uVar7;
        if (ppIVar1 < ppIVar4 + lVar3) {
          memmove(ppIVar1,ppIVar1 + 1,(~uVar7 + lVar3) * 8);
          iVar8 = (pIVar2->Windows).Size;
          iVar5 = iVar8 + -1;
          (pIVar2->Windows).Size = iVar5;
          if (iVar5 == (pIVar2->Windows).Capacity) {
            if (iVar5 == 0) {
              iVar5 = 8;
            }
            else {
              iVar5 = iVar5 / 2 + iVar5;
            }
            if (iVar8 < iVar5) {
              iVar8 = iVar5;
            }
            GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
            ppIVar4 = (ImGuiWindow **)
                      (*GImAllocatorAllocFunc)((long)iVar8 << 3,GImAllocatorUserData);
            ppIVar1 = (pIVar2->Windows).Data;
            if (ppIVar1 != (ImGuiWindow **)0x0) {
              memcpy(ppIVar4,ppIVar1,(long)(pIVar2->Windows).Size << 3);
              ppIVar1 = (pIVar2->Windows).Data;
              if (ppIVar1 != (ImGuiWindow **)0x0) {
                GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
              }
              (*GImAllocatorFreeFunc)(ppIVar1,GImAllocatorUserData);
            }
            (pIVar2->Windows).Data = ppIVar4;
            (pIVar2->Windows).Capacity = iVar8;
            iVar5 = (pIVar2->Windows).Size;
          }
          else {
            ppIVar4 = (pIVar2->Windows).Data;
          }
          ppIVar4[iVar5] = window;
          (pIVar2->Windows).Size = (pIVar2->Windows).Size + 1;
          return;
        }
        __assert_fail("it >= Data && it < Data+Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                      ,0x4e3,
                      "iterator ImVector<ImGuiWindow *>::erase(const_iterator) [T = ImGuiWindow *]")
        ;
      }
    } while (0 < (int)uVar6);
  }
  return;
}

Assistant:

void ImGui::BringWindowToFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* current_front_window = g.Windows.back();
    if (current_front_window == window || current_front_window->RootWindow == window)
        return;
    for (int i = g.Windows.Size - 2; i >= 0; i--) // We can ignore the front most window
        if (g.Windows[i] == window)
        {
            g.Windows.erase(g.Windows.Data + i);
            g.Windows.push_back(window);
            break;
        }
}